

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::PushGTestTrace(UnitTest *this,TraceInfo *trace)

{
  MutexBase *in_RDI;
  MutexLock lock;
  GTestMutexLock *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffd8;
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>
  *in_stack_ffffffffffffffe0;
  
  internal::GTestMutexLock::GTestMutexLock(in_stack_ffffffffffffffd0,in_RDI);
  internal::UnitTestImpl::gtest_trace_stack((UnitTestImpl *)0x1a7e72);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
  push_back(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x1a7e94);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().push_back(trace);
}